

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_failurecount_assertion.hpp
# Opt level: O0

void __thiscall
iutest::detail::StatementsFailureCount::StatementsFailureCount(StatementsFailureCount *this)

{
  StatementsFailureCount *this_local;
  
  NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>::Collector
            (&this->super_Collector<iutest::detail::NoTestPartResultReporter>);
  (this->super_Collector<iutest::detail::NoTestPartResultReporter>).super_NoTestPartResultReporter.
  super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (_func_int **)&PTR__StatementsFailureCount_0018ae78;
  return;
}

Assistant:

AssertionResult GetResult(size_t cnt, const char* stetements_str)
    {
        const size_t num = count();
        size_t n=0;
        for( size_t i=0; i < num; ++i )
        {
            if( GetTestPartResult(i).failed() )
            {
                ++n;
            }
        }
        if( n < cnt )
        {
            return AssertionSuccess();
        }
        AssertionResult ar = AssertionFailure() << stetements_str << "\nExpected: failure count less than " << cnt << "\n  Actual: " << n;
        ar << "\nReported results:";
        for( size_t i=0; i < num; ++i )
        {
            ar << "\n" << GetTestPartResult(i).message();
        }
        return ar;
    }